

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O1

BitMatrix *
ZXing::Inflate(BitMatrix *__return_storage_ptr__,BitMatrix *input,int width,int height,int quietZone
              )

{
  int iVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  int left;
  int iVar5;
  int iVar6;
  int x;
  
  iVar1 = input->_width;
  iVar6 = input->_height;
  iVar5 = iVar1 + quietZone * 2;
  if (width < iVar5) {
    width = iVar5;
  }
  iVar5 = iVar6 + quietZone * 2;
  if (height < iVar5) {
    height = iVar5;
  }
  if (iVar6 == height && iVar1 == width) {
    iVar5 = input->_height;
    __return_storage_ptr__->_width = input->_width;
    __return_storage_ptr__->_height = iVar5;
    puVar2 = (input->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (input->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (input->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (input->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (input->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (input->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar5 = (width + quietZone * -2) / iVar1;
    iVar4 = (height + quietZone * -2) / iVar6;
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
    BitMatrix::BitMatrix(__return_storage_ptr__,width,height);
    if (0 < input->_height) {
      iVar6 = (height - iVar6 * iVar5) / 2;
      iVar4 = 0;
      do {
        if (0 < input->_width) {
          x = 0;
          left = (width - iVar1 * iVar5) / 2;
          do {
            bVar3 = BitMatrix::get(input,x,iVar4);
            if (bVar3) {
              BitMatrix::setRegion(__return_storage_ptr__,left,iVar6,iVar5,iVar5);
            }
            x = x + 1;
            left = left + iVar5;
          } while (x < input->_width);
        }
        iVar4 = iVar4 + 1;
        iVar6 = iVar6 + iVar5;
      } while (iVar4 < input->_height);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix Inflate(BitMatrix&& input, int width, int height, int quietZone)
{
	const int codeWidth = input.width();
	const int codeHeight = input.height();
	const int outputWidth = std::max(width, codeWidth + 2 * quietZone);
	const int outputHeight = std::max(height, codeHeight + 2 * quietZone);

	if (input.width() == outputWidth && input.height() == outputHeight)
		return std::move(input);

	const int scale = std::min((outputWidth - 2*quietZone) / codeWidth, (outputHeight - 2*quietZone) / codeHeight);
	// Padding includes both the quiet zone and the extra white pixels to
	// accommodate the requested dimensions.
	const int leftPadding = (outputWidth - (codeWidth * scale)) / 2;
	const int topPadding = (outputHeight - (codeHeight * scale)) / 2;

	BitMatrix result(outputWidth, outputHeight);

	for (int inputY = 0, outputY = topPadding; inputY < input.height(); ++inputY, outputY += scale) {
		for (int inputX = 0, outputX = leftPadding; inputX < input.width(); ++inputX, outputX += scale) {
			if (input.get(inputX, inputY))
				result.setRegion(outputX, outputY, scale, scale);
		}
	}

	return result;
}